

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int __thiscall
cmCPackDebGenerator::PackageComponentsAllInOne(cmCPackDebGenerator *this,string *compInstDirName)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined4 extraout_var;
  ulong uVar7;
  string local_5a0 [32];
  undefined1 local_580 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_401;
  string local_400;
  cmAlphaNum local_3e0;
  cmAlphaNum local_3b0;
  undefined1 local_380 [8];
  string component_path;
  string local_358;
  allocator<char> local_331;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  allocator<char> local_2e9;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  cmValue local_280;
  undefined1 local_278 [8];
  string outputFileName;
  string packageFileName;
  string localToplevel;
  undefined1 local_1f8 [8];
  ostringstream cmCPackLog_msg;
  allocator<char> local_69;
  string local_68;
  cmValue local_48;
  string local_40 [8];
  string initialTopLevel;
  string *compInstDirName_local;
  cmCPackDebGenerator *this_local;
  
  initialTopLevel.field_2._8_8_ = compInstDirName;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CPACK_TEMPORARY_DIRECTORY",&local_69);
  local_48 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_68);
  psVar4 = cmValue::operator_cast_to_string_(&local_48);
  std::__cxx11::string::string(local_40,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  poVar5 = std::operator<<((ostream *)local_1f8,
                           "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
                          );
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x26e,pcVar6);
  std::__cxx11::string::~string((string *)(localToplevel.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::__cxx11::string::string((string *)(packageFileName.field_2._M_local_buf + 8),local_40);
  cmsys::SystemTools::GetParentDirectory
            ((string *)((long)&outputFileName.field_2 + 8),&(this->super_cmCPackGenerator).toplevel)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"CPACK_PACKAGE_FILE_NAME",&local_2a1);
  local_280 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2a0);
  psVar4 = cmValue::operator*[abi_cxx11_(&local_280);
  iVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278,
                 psVar4,(char *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    std::operator+(&local_2c8,"/",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   initialTopLevel.field_2._8_8_);
    std::__cxx11::string::operator+=
              ((string *)(packageFileName.field_2._M_local_buf + 8),(string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"CPACK_TEMPORARY_DIRECTORY",&local_2e9);
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,&local_2e8,(string *)((long)&packageFileName.field_2 + 8)
            );
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::operator+(&local_310,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
  std::__cxx11::string::operator+=
            ((string *)(outputFileName.field_2._M_local_buf + 8),(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"CPACK_OUTPUT_FILE_NAME",&local_331);
  cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_330,(string *)local_278);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
             (allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,&local_358,(string *)((long)&outputFileName.field_2 + 8))
  ;
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)(component_path.field_2._M_local_buf + 0xf));
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_3b0,'/');
    cmAlphaNum::cmAlphaNum(&local_3e0,(string *)initialTopLevel.field_2._8_8_);
    cmStrCat<>((string *)local_380,&local_3b0,&local_3e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"CPACK_DEB_PACKAGE_COMPONENT_PART_PATH",&local_401);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_400,(string *)local_380);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    std::__cxx11::string::~string((string *)local_380);
  }
  bVar2 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackDeb.cmake");
  if (bVar2) {
    bVar2 = createDebPackages(this);
    this_local._4_4_ = (uint)bVar2;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
    poVar5 = std::operator<<((ostream *)local_580,"Error while execution CPackDeb.cmake");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x28c,pcVar6);
    std::__cxx11::string::~string(local_5a0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
    this_local._4_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)(outputFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(packageFileName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_40);
  return this_local._4_4_;
}

Assistant:

int cmCPackDebGenerator::PackageComponentsAllInOne(
  const std::string& compInstDirName)
{
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  this->packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_[GROUPS_]IN_ONE_PACKAGE is set)"
                  << std::endl);

  // The ALL GROUPS in ONE package case
  std::string localToplevel(initialTopLevel);
  std::string packageFileName(
    cmSystemTools::GetParentDirectory(this->toplevel));
  std::string outputFileName(*this->GetOption("CPACK_PACKAGE_FILE_NAME") +
                             this->GetOutputExtension());
  // all GROUP in one vs all COMPONENT in one
  // if must be here otherwise non component paths have a trailing / while
  // components don't
  if (!compInstDirName.empty()) {
    localToplevel += "/" + compInstDirName;
  }

  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY", localToplevel);
  packageFileName += "/" + outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME", outputFileName);
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME", packageFileName);

  if (!compInstDirName.empty()) {
    // Tell CPackDeb.cmake the path where the component is.
    std::string component_path = cmStrCat('/', compInstDirName);
    this->SetOption("CPACK_DEB_PACKAGE_COMPONENT_PART_PATH", component_path);
  }
  if (!this->ReadListFile("Internal/CPack/CPackDeb.cmake")) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackDeb.cmake" << std::endl);
    return 0;
  }

  return this->createDebPackages();
}